

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

xmlChar ** parse_list(xmlChar *str)

{
  int iVar1;
  long lVar2;
  xmlChar **ppxVar3;
  bool bVar4;
  int indx;
  int len;
  int buffer_size;
  xmlChar **out;
  xmlChar **buffer;
  xmlChar *str_local;
  
  if (str == (xmlChar *)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else {
    iVar1 = xmlStrlen(str);
    buffer = (xmlChar **)str;
    if ((*str == '\'') && (str[iVar1 + -1] == '\'')) {
      str[iVar1 + -1] = '\0';
      buffer = (xmlChar **)(str + 1);
    }
    indx = 1000;
    out = (xmlChar **)(*_xmlMalloc)(8000);
    _len = out;
    if (out == (xmlChar **)0x0) {
      perror("malloc failed");
      str_local = (xmlChar *)0x0;
    }
    else {
      while (*(char *)buffer != '\0') {
        if ((long)(indx + -10) < (long)_len - (long)out >> 3) {
          lVar2 = (long)_len - (long)out;
          indx = indx << 1;
          out = (xmlChar **)(*_xmlRealloc)(out,(long)indx << 3);
          if (out == (xmlChar **)0x0) {
            perror("realloc failed");
            return (xmlChar **)0x0;
          }
          _len = out + (int)(lVar2 >> 3);
        }
        ppxVar3 = _len + 1;
        *_len = (xmlChar *)buffer;
        while( true ) {
          bVar4 = false;
          if (*(char *)buffer != ',') {
            bVar4 = *(char *)buffer != '\0';
          }
          if (!bVar4) break;
          buffer = (xmlChar **)((long)buffer + 1);
        }
        _len = ppxVar3;
        if (*(char *)buffer == ',') {
          *(undefined1 *)buffer = 0;
          buffer = (xmlChar **)((long)buffer + 1);
        }
      }
      *_len = (xmlChar *)0x0;
      str_local = (xmlChar *)out;
    }
  }
  return (xmlChar **)str_local;
}

Assistant:

static xmlChar **
parse_list(xmlChar *str) {
    xmlChar **buffer;
    xmlChar **out = NULL;
    int buffer_size = 0;
    int len;

    if(str == NULL) {
	return(NULL);
    }

    len = xmlStrlen(str);
    if((str[0] == '\'') && (str[len - 1] == '\'')) {
	str[len - 1] = '\0';
	str++;
    }
    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar **) xmlMalloc(buffer_size * sizeof(xmlChar*));
    if (buffer == NULL) {
	perror("malloc failed");
	return(NULL);
    }
    out = buffer;

    while(*str != '\0') {
	if (out - buffer > buffer_size - 10) {
	    int indx = out - buffer;

	    xxx_growBufferReentrant();
	    out = &buffer[indx];
	}
	(*out++) = str;
	while(*str != ',' && *str != '\0') ++str;
	if(*str == ',') *(str++) = '\0';
    }
    (*out) = NULL;
    return buffer;
}